

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

void xmlNodeDumpOutputInternal(xmlSaveCtxtPtr ctxt,xmlNodePtr cur)

{
  int iVar1;
  xmlOutputBufferPtr buf_00;
  long lVar2;
  long lVar3;
  _xmlNode *p_Var4;
  xmlOutputBufferPtr buf;
  xmlChar *end;
  xmlChar *start;
  xmlAttrPtr attr;
  xmlNodePtr parent;
  xmlNodePtr unformattedNode;
  xmlNodePtr root;
  xmlNodePtr tmp;
  xmlDocPtr pxStack_18;
  int format;
  xmlNodePtr cur_local;
  xmlSaveCtxtPtr ctxt_local;
  
  iVar1 = ctxt->format;
  parent = (xmlNodePtr)0x0;
  if (cur == (xmlNodePtr)0x0) {
    return;
  }
  buf_00 = ctxt->buf;
  attr = (xmlAttrPtr)cur->parent;
  pxStack_18 = (xmlDocPtr)cur;
LAB_0019e22e:
  p_Var4 = (_xmlNode *)attr;
  switch(pxStack_18->type) {
  case XML_ELEMENT_NODE:
    if ((pxStack_18 != (xmlDocPtr)cur) && (ctxt->format == 1)) {
      xmlSaveWriteIndent(ctxt,0);
    }
    if ((pxStack_18->parent == (_xmlNode *)attr) || (pxStack_18->children == (_xmlNode *)0x0)) {
      xmlOutputBufferWrite(buf_00,1,"<");
      lVar2._0_4_ = pxStack_18->compression;
      lVar2._4_4_ = pxStack_18->standalone;
      if ((lVar2 != 0) && (*(long *)(*(long *)&pxStack_18->compression + 0x18) != 0)) {
        xmlOutputBufferWriteString(buf_00,*(char **)(*(long *)&pxStack_18->compression + 0x18));
        xmlOutputBufferWrite(buf_00,1,":");
      }
      xmlOutputBufferWriteString(buf_00,pxStack_18->name);
      if (pxStack_18->oldNs != (_xmlNs *)0x0) {
        xmlNsListDumpOutputCtxt(ctxt,pxStack_18->oldNs);
      }
      for (start = (xmlChar *)pxStack_18->extSubset; start != (xmlChar *)0x0;
          start = *(xmlChar **)(start + 0x30)) {
        xmlAttrDumpOutput(ctxt,(xmlAttrPtr)start);
      }
      if (pxStack_18->children != (_xmlNode *)0x0) {
        if (ctxt->format == 1) {
          for (root = pxStack_18->children; root != (xmlNodePtr)0x0; root = root->next) {
            if (((root->type == XML_TEXT_NODE) || (root->type == XML_CDATA_SECTION_NODE)) ||
               (root->type == XML_ENTITY_REF_NODE)) {
              ctxt->format = 0;
              parent = (xmlNodePtr)pxStack_18;
              break;
            }
          }
        }
        if (ctxt->format == 2) {
          xmlOutputBufferWriteWSNonSig(ctxt,1);
        }
        xmlOutputBufferWrite(buf_00,1,">");
        if (ctxt->format == 1) {
          xmlOutputBufferWrite(buf_00,1,"\n");
        }
        if (-1 < ctxt->level) {
          ctxt->level = ctxt->level + 1;
        }
        attr = (xmlAttrPtr)pxStack_18;
        pxStack_18 = (xmlDocPtr)pxStack_18->children;
        goto LAB_0019e22e;
      }
      if ((ctxt->options & 4U) == 0) {
        if (ctxt->format == 2) {
          xmlOutputBufferWriteWSNonSig(ctxt,0);
        }
        xmlOutputBufferWrite(buf_00,2,"/>");
      }
      else {
        if (ctxt->format == 2) {
          xmlOutputBufferWriteWSNonSig(ctxt,1);
        }
        xmlOutputBufferWrite(buf_00,3,"></");
        lVar3._0_4_ = pxStack_18->compression;
        lVar3._4_4_ = pxStack_18->standalone;
        if ((lVar3 != 0) && (*(long *)(*(long *)&pxStack_18->compression + 0x18) != 0)) {
          xmlOutputBufferWriteString(buf_00,*(char **)(*(long *)&pxStack_18->compression + 0x18));
          xmlOutputBufferWrite(buf_00,1,":");
        }
        xmlOutputBufferWriteString(buf_00,pxStack_18->name);
        if (ctxt->format == 2) {
          xmlOutputBufferWriteWSNonSig(ctxt,0);
        }
        xmlOutputBufferWrite(buf_00,1,">");
      }
    }
    else {
      xmlNodeDumpOutputInternal(ctxt,(xmlNodePtr)pxStack_18);
    }
    break;
  case XML_ATTRIBUTE_NODE:
    xmlAttrDumpOutput(ctxt,(xmlAttrPtr)pxStack_18);
    break;
  case XML_TEXT_NODE:
    if (pxStack_18->intSubset != (_xmlDtd *)0x0) {
      if ((xmlChar *)pxStack_18->name == "textnoenc") {
        xmlOutputBufferWriteString(buf_00,(char *)pxStack_18->intSubset);
      }
      else if (ctxt->escape == (xmlCharEncodingOutputFunc)0x0) {
        xmlSaveWriteText(ctxt,(xmlChar *)pxStack_18->intSubset,0);
      }
      else {
        xmlOutputBufferWriteEscape(buf_00,(xmlChar *)pxStack_18->intSubset,ctxt->escape);
      }
    }
    break;
  case XML_CDATA_SECTION_NODE:
    if ((pxStack_18->intSubset == (_xmlDtd *)0x0) ||
       (*(char *)&pxStack_18->intSubset->_private == '\0')) {
      xmlOutputBufferWrite(buf_00,0xc,"<![CDATA[]]>");
    }
    else {
      buf = (xmlOutputBufferPtr)pxStack_18->intSubset;
      end = (xmlChar *)buf;
      for (; *(char *)&buf->context != '\0'; buf = (xmlOutputBufferPtr)((long)&buf->context + 1)) {
        if (((*(char *)&buf->context == ']') && (*(char *)((long)&buf->context + 1) == ']')) &&
           (*(char *)((long)&buf->context + 2) == '>')) {
          buf = (xmlOutputBufferPtr)((long)&buf->context + 2);
          xmlOutputBufferWrite(buf_00,9,"<![CDATA[");
          xmlOutputBufferWrite(buf_00,(int)buf - (int)end,(char *)end);
          xmlOutputBufferWrite(buf_00,3,"]]>");
          end = (xmlChar *)buf;
        }
      }
      if ((xmlOutputBufferPtr)end != buf) {
        xmlOutputBufferWrite(buf_00,9,"<![CDATA[");
        xmlOutputBufferWriteString(buf_00,(char *)end);
        xmlOutputBufferWrite(buf_00,3,"]]>");
      }
    }
    break;
  case XML_ENTITY_REF_NODE:
    xmlOutputBufferWrite(buf_00,1,"&");
    xmlOutputBufferWriteString(buf_00,pxStack_18->name);
    xmlOutputBufferWrite(buf_00,1,";");
    break;
  default:
    break;
  case XML_PI_NODE:
    if ((pxStack_18 != (xmlDocPtr)cur) && (ctxt->format == 1)) {
      xmlSaveWriteIndent(ctxt,0);
    }
    if (pxStack_18->intSubset == (_xmlDtd *)0x0) {
      xmlOutputBufferWrite(buf_00,2,"<?");
      xmlOutputBufferWriteString(buf_00,pxStack_18->name);
      if (ctxt->format == 2) {
        xmlOutputBufferWriteWSNonSig(ctxt,0);
      }
      xmlOutputBufferWrite(buf_00,2,"?>");
    }
    else {
      xmlOutputBufferWrite(buf_00,2,"<?");
      xmlOutputBufferWriteString(buf_00,pxStack_18->name);
      if (pxStack_18->intSubset != (_xmlDtd *)0x0) {
        if (ctxt->format == 2) {
          xmlOutputBufferWriteWSNonSig(ctxt,0);
        }
        else {
          xmlOutputBufferWrite(buf_00,1," ");
        }
        xmlOutputBufferWriteString(buf_00,(char *)pxStack_18->intSubset);
      }
      xmlOutputBufferWrite(buf_00,2,"?>");
    }
    break;
  case XML_COMMENT_NODE:
    if ((pxStack_18 != (xmlDocPtr)cur) && (ctxt->format == 1)) {
      xmlSaveWriteIndent(ctxt,0);
    }
    if (pxStack_18->intSubset != (_xmlDtd *)0x0) {
      xmlOutputBufferWrite(buf_00,4,"<!--");
      xmlOutputBufferWriteString(buf_00,(char *)pxStack_18->intSubset);
      xmlOutputBufferWrite(buf_00,3,"-->");
    }
    break;
  case XML_DOCUMENT_NODE:
  case XML_HTML_DOCUMENT_NODE:
    xmlSaveDocInternal(ctxt,pxStack_18,ctxt->encoding);
    break;
  case XML_DOCUMENT_FRAG_NODE:
    if ((pxStack_18->parent != (_xmlNode *)attr) || (pxStack_18->children == (_xmlNode *)0x0))
    break;
    attr = (xmlAttrPtr)pxStack_18;
    pxStack_18 = (xmlDocPtr)pxStack_18->children;
    goto LAB_0019e22e;
  case XML_DTD_NODE:
    xmlDtdDumpOutput(ctxt,(xmlDtdPtr)pxStack_18);
    break;
  case XML_ELEMENT_DECL:
    xmlBufDumpElementDecl(buf_00,(xmlElementPtr)pxStack_18);
    break;
  case XML_ATTRIBUTE_DECL:
    xmlBufDumpAttributeDecl(buf_00,(xmlAttributePtr)pxStack_18);
    break;
  case XML_ENTITY_DECL:
    xmlBufDumpEntityDecl(buf_00,(xmlEntityPtr)pxStack_18);
    break;
  case XML_NAMESPACE_DECL:
    xmlNsDumpOutput(buf_00,(xmlNsPtr)pxStack_18,ctxt);
  }
  while( true ) {
    attr = (xmlAttrPtr)p_Var4;
    if (pxStack_18 == (xmlDocPtr)cur) {
      return;
    }
    if (((ctxt->format == 1) && (pxStack_18->type != XML_XINCLUDE_START)) &&
       (pxStack_18->type != XML_XINCLUDE_END)) {
      xmlOutputBufferWrite(buf_00,1,"\n");
    }
    if (pxStack_18->next != (_xmlNode *)0x0) break;
    pxStack_18 = (xmlDocPtr)attr;
    p_Var4 = attr->parent;
    if (attr->type == XML_ELEMENT_NODE) {
      if (0 < ctxt->level) {
        ctxt->level = ctxt->level + -1;
      }
      if (ctxt->format == 1) {
        xmlSaveWriteIndent(ctxt,0);
      }
      xmlOutputBufferWrite(buf_00,2,"</");
      if ((attr->ns != (xmlNs *)0x0) && (attr->ns->prefix != (xmlChar *)0x0)) {
        xmlOutputBufferWriteString(buf_00,(char *)attr->ns->prefix);
        xmlOutputBufferWrite(buf_00,1,":");
      }
      xmlOutputBufferWriteString(buf_00,(char *)attr->name);
      if (ctxt->format == 2) {
        xmlOutputBufferWriteWSNonSig(ctxt,0);
      }
      xmlOutputBufferWrite(buf_00,1,">");
      if ((xmlNodePtr)attr == parent) {
        ctxt->format = iVar1;
        parent = (xmlNodePtr)0x0;
      }
    }
  }
  pxStack_18 = (xmlDocPtr)pxStack_18->next;
  goto LAB_0019e22e;
}

Assistant:

static void
xmlNodeDumpOutputInternal(xmlSaveCtxtPtr ctxt, xmlNodePtr cur) {
    int format = ctxt->format;
    xmlNodePtr tmp, root, unformattedNode = NULL, parent;
    xmlAttrPtr attr;
    xmlChar *start, *end;
    xmlOutputBufferPtr buf;

    if (cur == NULL) return;
    buf = ctxt->buf;

    root = cur;
    parent = cur->parent;
    while (1) {
        switch (cur->type) {
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
	    xmlSaveDocInternal(ctxt, (xmlDocPtr) cur, ctxt->encoding);
	    break;

        case XML_DTD_NODE:
            xmlDtdDumpOutput(ctxt, (xmlDtdPtr) cur);
            break;

        case XML_DOCUMENT_FRAG_NODE:
            /* Always validate cur->parent when descending. */
            if ((cur->parent == parent) && (cur->children != NULL)) {
                parent = cur;
                cur = cur->children;
                continue;
            }
	    break;

        case XML_ELEMENT_DECL:
            xmlBufDumpElementDecl(buf, (xmlElementPtr) cur);
            break;

        case XML_ATTRIBUTE_DECL:
            xmlBufDumpAttributeDecl(buf, (xmlAttributePtr) cur);
            break;

        case XML_ENTITY_DECL:
            xmlBufDumpEntityDecl(buf, (xmlEntityPtr) cur);
            break;

        case XML_ELEMENT_NODE:
	    if ((cur != root) && (ctxt->format == 1))
                xmlSaveWriteIndent(ctxt, 0);

            /*
             * Some users like lxml are known to pass nodes with a corrupted
             * tree structure. Fall back to a recursive call to handle this
             * case.
             */
            if ((cur->parent != parent) && (cur->children != NULL)) {
                xmlNodeDumpOutputInternal(ctxt, cur);
                break;
            }

            xmlOutputBufferWrite(buf, 1, "<");
            if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                xmlOutputBufferWriteString(buf, (const char *)cur->ns->prefix);
                xmlOutputBufferWrite(buf, 1, ":");
            }
            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            if (cur->nsDef)
                xmlNsListDumpOutputCtxt(ctxt, cur->nsDef);
            for (attr = cur->properties; attr != NULL; attr = attr->next)
                xmlAttrDumpOutput(ctxt, attr);

            if (cur->children == NULL) {
                if ((ctxt->options & XML_SAVE_NO_EMPTY) == 0) {
                    if (ctxt->format == 2)
                        xmlOutputBufferWriteWSNonSig(ctxt, 0);
                    xmlOutputBufferWrite(buf, 2, "/>");
                } else {
                    if (ctxt->format == 2)
                        xmlOutputBufferWriteWSNonSig(ctxt, 1);
                    xmlOutputBufferWrite(buf, 3, "></");
                    if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                        xmlOutputBufferWriteString(buf,
                                (const char *)cur->ns->prefix);
                        xmlOutputBufferWrite(buf, 1, ":");
                    }
                    xmlOutputBufferWriteString(buf, (const char *)cur->name);
                    if (ctxt->format == 2)
                        xmlOutputBufferWriteWSNonSig(ctxt, 0);
                    xmlOutputBufferWrite(buf, 1, ">");
                }
            } else {
                if (ctxt->format == 1) {
                    tmp = cur->children;
                    while (tmp != NULL) {
                        if ((tmp->type == XML_TEXT_NODE) ||
                            (tmp->type == XML_CDATA_SECTION_NODE) ||
                            (tmp->type == XML_ENTITY_REF_NODE)) {
                            ctxt->format = 0;
                            unformattedNode = cur;
                            break;
                        }
                        tmp = tmp->next;
                    }
                }
                if (ctxt->format == 2)
                    xmlOutputBufferWriteWSNonSig(ctxt, 1);
                xmlOutputBufferWrite(buf, 1, ">");
                if (ctxt->format == 1) xmlOutputBufferWrite(buf, 1, "\n");
                if (ctxt->level >= 0) ctxt->level++;
                parent = cur;
                cur = cur->children;
                continue;
            }

            break;

        case XML_TEXT_NODE:
	    if (cur->content == NULL)
                break;
	    if (cur->name != xmlStringTextNoenc) {
                if (ctxt->escape)
                    xmlOutputBufferWriteEscape(buf, cur->content,
                                               ctxt->escape);
#ifdef TEST_OUTPUT_BUFFER_WRITE_ESCAPE
                else if (ctxt->encoding)
                    xmlOutputBufferWriteEscape(buf, cur->content, NULL);
#endif
                else
                    xmlSaveWriteText(ctxt, cur->content, /* flags */ 0);
	    } else {
		/*
		 * Disable escaping, needed for XSLT
		 */
		xmlOutputBufferWriteString(buf, (const char *) cur->content);
	    }
	    break;

        case XML_PI_NODE:
	    if ((cur != root) && (ctxt->format == 1))
                xmlSaveWriteIndent(ctxt, 0);

            if (cur->content != NULL) {
                xmlOutputBufferWrite(buf, 2, "<?");
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                if (cur->content != NULL) {
                    if (ctxt->format == 2)
                        xmlOutputBufferWriteWSNonSig(ctxt, 0);
                    else
                        xmlOutputBufferWrite(buf, 1, " ");
                    xmlOutputBufferWriteString(buf,
                            (const char *)cur->content);
                }
                xmlOutputBufferWrite(buf, 2, "?>");
            } else {
                xmlOutputBufferWrite(buf, 2, "<?");
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                if (ctxt->format == 2)
                    xmlOutputBufferWriteWSNonSig(ctxt, 0);
                xmlOutputBufferWrite(buf, 2, "?>");
            }
            break;

        case XML_COMMENT_NODE:
	    if ((cur != root) && (ctxt->format == 1))
                xmlSaveWriteIndent(ctxt, 0);

            if (cur->content != NULL) {
                xmlOutputBufferWrite(buf, 4, "<!--");
                xmlOutputBufferWriteString(buf, (const char *)cur->content);
                xmlOutputBufferWrite(buf, 3, "-->");
            }
            break;

        case XML_ENTITY_REF_NODE:
            xmlOutputBufferWrite(buf, 1, "&");
            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            xmlOutputBufferWrite(buf, 1, ";");
            break;

        case XML_CDATA_SECTION_NODE:
            if (cur->content == NULL || *cur->content == '\0') {
                xmlOutputBufferWrite(buf, 12, "<![CDATA[]]>");
            } else {
                start = end = cur->content;
                while (*end != '\0') {
                    if ((*end == ']') && (*(end + 1) == ']') &&
                        (*(end + 2) == '>')) {
                        end = end + 2;
                        xmlOutputBufferWrite(buf, 9, "<![CDATA[");
                        xmlOutputBufferWrite(buf, end - start,
                                (const char *)start);
                        xmlOutputBufferWrite(buf, 3, "]]>");
                        start = end;
                    }
                    end++;
                }
                if (start != end) {
                    xmlOutputBufferWrite(buf, 9, "<![CDATA[");
                    xmlOutputBufferWriteString(buf, (const char *)start);
                    xmlOutputBufferWrite(buf, 3, "]]>");
                }
            }
            break;

        case XML_ATTRIBUTE_NODE:
            xmlAttrDumpOutput(ctxt, (xmlAttrPtr) cur);
            break;

        case XML_NAMESPACE_DECL:
            xmlNsDumpOutput(buf, (xmlNsPtr) cur, ctxt);
            break;

        default:
            break;
        }

        while (1) {
            if (cur == root)
                return;
            if ((ctxt->format == 1) &&
                (cur->type != XML_XINCLUDE_START) &&
                (cur->type != XML_XINCLUDE_END))
                xmlOutputBufferWrite(buf, 1, "\n");
            if (cur->next != NULL) {
                cur = cur->next;
                break;
            }

            cur = parent;
            /* cur->parent was validated when descending. */
            parent = cur->parent;

            if (cur->type == XML_ELEMENT_NODE) {
                if (ctxt->level > 0) ctxt->level--;
                if (ctxt->format == 1)
                    xmlSaveWriteIndent(ctxt, 0);

                xmlOutputBufferWrite(buf, 2, "</");
                if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                    xmlOutputBufferWriteString(buf,
                            (const char *)cur->ns->prefix);
                    xmlOutputBufferWrite(buf, 1, ":");
                }

                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                if (ctxt->format == 2)
                    xmlOutputBufferWriteWSNonSig(ctxt, 0);
                xmlOutputBufferWrite(buf, 1, ">");

                if (cur == unformattedNode) {
                    ctxt->format = format;
                    unformattedNode = NULL;
                }
            }
        }
    }
}